

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
UA_Server_setVariableNode_valueCallback
          (UA_Server *server,UA_NodeId nodeId,UA_ValueCallback callback)

{
  UA_StatusCode UVar1;
  UA_StatusCode retval;
  UA_Server *server_local;
  
  UVar1 = UA_Server_editNode(server,&adminSession,&nodeId,setValueCallback,&callback);
  return UVar1;
}

Assistant:

UA_StatusCode
UA_Server_setVariableNode_valueCallback(UA_Server *server, const UA_NodeId nodeId,
                                        const UA_ValueCallback callback) {
    UA_RCU_LOCK();
    UA_StatusCode retval = UA_Server_editNode(server, &adminSession, &nodeId,
                                              (UA_EditNodeCallback)setValueCallback, &callback);
    UA_RCU_UNLOCK();
    return retval;
}